

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool read_input(bool filename_is_code,string *filename,string *input)

{
  bool bVar1;
  undefined7 in_register_00000039;
  string local_40;
  
  if ((int)CONCAT71(in_register_00000039,filename_is_code) == 0) {
    std::__cxx11::string::string((string *)&local_40,(string *)filename);
    bVar1 = read_input_content(&local_40,input);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::__cxx11::string::_M_assign((string *)input);
    bVar1 = true;
  }
  change_special_filename(filename_is_code,filename);
  return bVar1;
}

Assistant:

bool read_input(
    bool filename_is_code, std::string *filename, std::string *input)
{
    bool ok;
    if (filename_is_code) {
        *input = *filename;
        ok = true;
    } else {
        ok = read_input_content(*filename, input);
    }
    // Let's change the filename to something we can show the user
    // if it is not a real filename.
    change_special_filename(filename_is_code, filename);
    return ok;
}